

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translit.cpp
# Opt level: O1

void __thiscall
icu_63::Transliterator::Transliterator
          (Transliterator *this,UnicodeString *theID,UnicodeFilter *adoptedFilter)

{
  UnicodeString *this_00;
  ushort uVar1;
  int iVar2;
  int iVar3;
  UChar local_1a;
  
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__Transliterator_004793b0;
  this_00 = &this->ID;
  icu_63::UnicodeString::UnicodeString(this_00,theID);
  this->filter = adoptedFilter;
  this->maximumContextLength = 0;
  local_1a = L'\0';
  icu_63::UnicodeString::doAppend(this_00,&local_1a,0,1);
  uVar1 = (this->ID).fUnion.fStackFields.fLengthAndFlags;
  if ((short)uVar1 < 0) {
    iVar3 = (this->ID).fUnion.fFields.fLength;
  }
  else {
    iVar3 = (int)(short)uVar1 >> 5;
  }
  iVar2 = iVar3 + -1;
  if (iVar2 == 0 && ((int)(short)uVar1 & 1U) != 0) {
    icu_63::UnicodeString::unBogus(this_00);
  }
  else if (iVar3 != 0) {
    if (iVar3 < 0x401) {
      (this->ID).fUnion.fStackFields.fLengthAndFlags = (short)iVar2 * 0x20 | uVar1 & 0x1f;
    }
    else {
      (this->ID).fUnion.fStackFields.fLengthAndFlags = uVar1 | 0xffe0;
      (this->ID).fUnion.fFields.fLength = iVar2;
    }
  }
  return;
}

Assistant:

Transliterator::Transliterator(const UnicodeString& theID,
                               UnicodeFilter* adoptedFilter) :
    UObject(), ID(theID), filter(adoptedFilter),
    maximumContextLength(0)
{
    // NUL-terminate the ID string, which is a non-aliased copy.
    ID.append((UChar)0);
    ID.truncate(ID.length()-1);
}